

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O2

GlobalSymbolStream * __thiscall
PDB::DBIStream::CreateGlobalSymbolStream
          (GlobalSymbolStream *__return_storage_ptr__,DBIStream *this,RawFile *file)

{
  HashTableHeader HVar1;
  DirectMSFStream globalStream;
  DirectMSFStream local_40;
  
  RawFile::CreateMSFStream<PDB::DirectMSFStream>
            (&local_40,file,(uint)(this->m_header).globalStreamIndex);
  HVar1 = DirectMSFStream::ReadAtOffset<PDB::HashTableHeader>(&local_40,0);
  GlobalSymbolStream::GlobalSymbolStream
            (__return_storage_ptr__,file,(this->m_header).globalStreamIndex,
             (uint)(HVar1._8_8_ >> 3) & 0x1fffffff);
  return __return_storage_ptr__;
}

Assistant:

PDB_NO_DISCARD PDB::GlobalSymbolStream PDB::DBIStream::CreateGlobalSymbolStream(const RawFile& file) const PDB_NO_EXCEPT
{
	DirectMSFStream globalStream = file.CreateMSFStream<DirectMSFStream>(m_header.globalStreamIndex);

	// the global symbol stream starts with a hash table header.
	// we use this to work out how many symbol records are referenced by the global symbol stream.
	const HashTableHeader hashHeader = globalStream.ReadAtOffset<HashTableHeader>(0u);
	const uint32_t recordCount = hashHeader.size / sizeof(HashRecord);

	return GlobalSymbolStream(file, m_header.globalStreamIndex, recordCount);
}